

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  Literal *other;
  Literals *__range1;
  bool bVar5;
  Literal local_90;
  Literal local_78;
  Literal *local_60;
  long local_58;
  ulong *local_50;
  ostream *local_48;
  ulong local_40;
  uint local_38;
  char local_31;
  
  lVar3 = __tls_get_addr(&PTR_01099ea8);
  local_50 = (ulong *)(lVar3 + 0x818);
  local_40 = *local_50;
  *local_50 = local_40 + 1;
  if (local_40 + 1 < 100) {
    if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 1) {
      Literal::Literal(&local_78,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      operator<<(o,&local_78);
      Literal::~Literal(&local_78);
    }
    else {
      local_31 = '(';
      std::__ostream_insert<char,std::char_traits<char>>(o,&local_31,1);
      sVar1 = (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
      lVar3 = ((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_48 = o;
      if (lVar3 + sVar1 != 0) {
        local_60 = (literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
        local_58 = sVar1 + lVar3 + -1;
        local_38 = (uint)CONCAT71((int7)((ulong)local_58 >> 8),1);
        lVar4 = -0x18;
        lVar3 = 0;
        do {
          other = (Literal *)
                  ((long)&((literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start)->field_0 + lVar4);
          if (lVar3 == 0) {
            other = local_60;
          }
          uVar2 = *local_50;
          if (uVar2 < 100) {
            if ((local_38 & 1) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>(local_48,", ",2);
            }
            else {
              local_38 = 0;
            }
            Literal::Literal(&local_90,other);
            operator<<(local_48,&local_90);
            Literal::~Literal(&local_90);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(local_48,"[..]",4);
          }
          if (99 < uVar2) break;
          lVar4 = lVar4 + 0x18;
          bVar5 = local_58 != lVar3;
          lVar3 = lVar3 + 1;
        } while (bVar5);
      }
      local_31 = ')';
      o = std::__ostream_insert<char,std::char_traits<char>>(local_48,&local_31,1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(o,"[..]",4);
  }
  if (local_40 == 0) {
    *local_50 = 0;
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  PrintLimiter limiter;

  if (limiter.stop()) {
    return o << "[..]";
  }

  if (literals.size() == 1) {
    return o << literals[0];
  }

  o << '(';
  bool first = true;
  for (auto& literal : literals) {
    if (limiter.stop()) {
      o << "[..]";
      break;
    }
    if (first) {
      first = false;
    } else {
      o << ", ";
    }
    o << literal;
  }
  return o << ')';
}